

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::CalculatePosition
          (SscWriterGeneric *this,BlockVecVec *writerVecVec,BlockVecVec *readerVecVec,int writerRank
          ,RankPosMap *allOverlapRanks)

{
  _Hash_node_base **pp_Var1;
  mapped_type *pmVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  int iVar5;
  __node_base _Var6;
  bool bVar7;
  unsigned_long uVar8;
  _Hash_node_base *p_Var9;
  RankPosMap currentReaderOverlapWriterRanks;
  key_type local_80;
  int local_7c;
  _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_78;
  BlockVecVec *local_70;
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  p_Var9 = (allOverlapRanks->_M_h)._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    local_7c = writerRank;
    local_78 = (_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)allOverlapRanks;
    local_70 = readerVecVec;
    do {
      CalculateOverlap((RankPosMap *)&local_68,writerVecVec,
                       (local_70->
                       super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + *(int *)&p_Var9[1]._M_nxt);
      local_80 = 0;
      if (0 < (int)((ulong)((long)(writerVecVec->
                                  super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(writerVecVec->
                                 super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        uVar8 = 0;
        do {
          _Var6._M_nxt = local_68._M_before_begin._M_nxt;
          if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            do {
              bVar7 = false;
              if (*(int *)&_Var6._M_nxt[1]._M_nxt == local_80) {
                bVar7 = true;
                break;
              }
              pp_Var1 = &(_Var6._M_nxt)->_M_nxt;
              _Var6._M_nxt = *pp_Var1;
            } while (*pp_Var1 != (_Hash_node_base *)0x0);
            if (bVar7) {
              pmVar2 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_68,&local_80);
              pmVar2->first = uVar8;
              sVar3 = TotalDataSize((writerVecVec->
                                    super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + local_80);
              pmVar2 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_68,&local_80);
              pmVar2->second = sVar3 + 1;
              uVar8 = uVar8 + sVar3 + 1;
            }
          }
          local_80 = local_80 + 1;
          iVar5 = (int)((ulong)((long)(writerVecVec->
                                      super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(writerVecVec->
                                     super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3);
        } while (SBORROW4(local_80,iVar5 * -0x55555555) != local_80 + iVar5 * 0x55555555 < 0);
      }
      pmVar2 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,&local_7c);
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_78,(key_type *)(p_Var9 + 1));
      uVar8 = pmVar2->second;
      pmVar4->first = pmVar2->first;
      pmVar4->second = uVar8;
      std::
      _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void SscWriterGeneric::CalculatePosition(ssc::BlockVecVec &writerVecVec,
                                         ssc::BlockVecVec &readerVecVec, const int writerRank,
                                         ssc::RankPosMap &allOverlapRanks)
{
    for (auto &overlapRank : allOverlapRanks)
    {
        auto &readerRankMap = readerVecVec[overlapRank.first];
        auto currentReaderOverlapWriterRanks = CalculateOverlap(writerVecVec, readerRankMap);
        size_t bufferPosition = 0;
        for (int rank = 0; rank < static_cast<int>(writerVecVec.size()); ++rank)
        {
            bool hasOverlap = false;
            for (const auto &r : currentReaderOverlapWriterRanks)
            {
                if (r.first == rank)
                {
                    hasOverlap = true;
                    break;
                }
            }
            if (hasOverlap)
            {
                currentReaderOverlapWriterRanks[rank].first = bufferPosition;
                auto &bv = writerVecVec[rank];
                size_t currentRankTotalSize = TotalDataSize(bv) + 1;
                currentReaderOverlapWriterRanks[rank].second = currentRankTotalSize;
                bufferPosition += currentRankTotalSize;
            }
        }
        allOverlapRanks[overlapRank.first] = currentReaderOverlapWriterRanks[writerRank];
    }
}